

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall SetElem::gen(SetElem *this,int b,int a)

{
  element_type *peVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  shared_ptr<Expr> local_88;
  undefined1 local_78 [8];
  string s2;
  shared_ptr<Expr> local_48;
  undefined1 local_38 [8];
  string s1;
  int a_local;
  int b_local;
  SetElem *this_local;
  
  s1.field_2._8_4_ = a;
  s1.field_2._12_4_ = b;
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->index);
  (*(peVar1->super_Node)._vptr_Node[3])();
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_48);
  (*(peVar1->super_Node)._vptr_Node[6])(local_38);
  std::shared_ptr<Expr>::~shared_ptr(&local_48);
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->expr);
  (*(peVar1->super_Node)._vptr_Node[3])(&local_88);
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_88);
  (*(peVar1->super_Node)._vptr_Node[6])(local_78);
  std::shared_ptr<Expr>::~shared_ptr(&local_88);
  peVar2 = std::__shared_ptr_access<Id,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Id,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->arr);
  (*(peVar2->super_Expr).super_Node._vptr_Node[6])(&local_128);
  std::operator+(&local_108,&local_128," [ ");
  std::operator+(&local_e8,&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_c8,&local_e8," ] = ");
  std::operator+(&local_a8,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  Node::emit((Node *)this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void gen(int b, int a) override {
		std::string s1 = index->reduce()->toString();
		std::string s2 = expr->reduce()->toString();

		emit(arr->toString() + " [ " + s1 + " ] = " + s2);
	}